

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbtsub.c
# Opt level: O3

void newbltchar(LispPTR *args)

{
  DLword *ybase;
  ushort uVar1;
  ushort uVar2;
  DLword DVar3;
  bool bVar4;
  DLword *pDVar5;
  ulong uVar6;
  uint *puVar7;
  sbyte sVar8;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  uint *puVar15;
  uint uVar16;
  ushort uVar17;
  ushort uVar18;
  uint uVar19;
  uint *puVar20;
  ushort uVar21;
  uint uVar22;
  uint uVar23;
  uint *puVar24;
  UNSIGNED x;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint *puVar30;
  uint local_90;
  uint local_8c;
  uint local_80;
  uint local_7c;
  uint local_64;
  uint local_58;
  sbyte sVar9;
  
  uVar6 = (ulong)args[2];
  if ((args[2] & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar6);
  }
  pDVar5 = Lisp_world;
  if (((ushort)((ushort)*args >> 8) == Lisp_world[uVar6 + 0x3e]) &&
     (*(int *)(Lisp_world + uVar6 + 0xe) == 0)) {
    uVar27 = *(uint *)(Lisp_world + uVar6);
    if ((uVar27 & 0xfff0000) == 0xf0000) {
      uVar27 = uVar27 | 0xffff0000;
    }
    else {
      if ((uVar27 & 0xfff0000) != 0xe0000) goto LAB_001101e2;
      uVar27 = uVar27 & 0xffff;
    }
    uVar10 = *(uint *)(Lisp_world + uVar6 + 0x18);
    if ((uVar10 & 0xfff0000) == 0xf0000) {
      uVar10 = uVar10 | 0xffff0000;
    }
    else {
      if ((uVar10 & 0xfff0000) != 0xe0000) goto LAB_001101e2;
      uVar10 = uVar10 & 0xffff;
    }
    uVar19 = *(uint *)(Lisp_world + uVar6 + 0x1a);
    if ((uVar19 & 0xfff0000) == 0xf0000) {
      uVar19 = uVar19 | 0xffff0000;
    }
    else {
      if ((uVar19 & 0xfff0000) != 0xe0000) goto LAB_001101e2;
      uVar19 = uVar19 & 0xffff;
    }
    uVar14 = *(uint *)(Lisp_world + uVar6 + 4);
    if ((uVar14 & 0xfff0000) == 0xf0000) {
      uVar14 = uVar14 | 0xffff0000;
    }
    else {
      if ((uVar14 & 0xfff0000) != 0xe0000) goto LAB_001101e2;
      uVar14 = uVar14 & 0xffff;
    }
    uVar16 = (uint)(byte)(ushort)*args;
    iVar13 = *(ushort *)((ulong)(Lisp_world + (*(int *)(Lisp_world + uVar6 + 0x30) + uVar16)) ^ 2) +
             uVar27;
    if ((((int)uVar27 <= (int)uVar19) || (iVar13 <= (int)uVar10)) && (args[1] == *TOPWDS68k)) {
      uVar10 = *(ushort *)((ulong)(Lisp_world + (uVar16 + *(int *)(Lisp_world + uVar6 + 0x10))) ^ 2)
               + uVar27;
      uVar19 = uVar27 + 0xe0000 +
               (uint)*(ushort *)
                      ((ulong)(Lisp_world + (uVar16 + *(int *)(Lisp_world + uVar6 + 0x10))) ^ 2);
      if (0xffff < uVar10) {
        uVar19 = uVar10 & 0xffff | 0xf0000;
      }
      *(uint *)(Lisp_world + uVar6) = uVar19;
      uVar27 = uVar27 + uVar14;
      uVar14 = iVar13 + uVar14;
      if ((int)(uint)pDVar5[uVar6 + 0x22] <= (int)uVar14) {
        uVar14 = (uint)pDVar5[uVar6 + 0x22];
      }
      x = (UNSIGNED)pDVar5[uVar6 + 0x23];
      if ((int)(uint)pDVar5[uVar6 + 0x23] < (int)uVar27) {
        x = (UNSIGNED)uVar27;
      }
      uVar26 = (ulong)*(uint *)(pDVar5 + uVar6 + 0x2a);
      uVar10 = (uint)x;
      if ((*(uint *)(pDVar5 + uVar6 + 0x2a) & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar26);
      }
      uVar1 = Lisp_world[uVar26 + 8];
      if (uVar1 == 0) {
        return;
      }
      iVar13 = uVar14 - uVar10;
      if (iVar13 < 1) {
        return;
      }
      ybase = Lisp_world +
              ((ulong)Lisp_world[uVar26 + 1] | (ulong)(uint)(*(int *)(Lisp_world + uVar26) << 0x10))
      ;
      uVar2 = Lisp_world[uVar26 + 0xb];
      uVar17 = uVar2 >> 9 & 3;
      DVar3 = Lisp_world[uVar26 + 6];
      uVar18 = -DVar3;
      if (0 < (short)DVar3) {
        uVar18 = DVar3;
      }
      DVar3 = Lisp_world[uVar26 + 2];
      uVar21 = -DVar3;
      if (0 < (short)DVar3) {
        uVar21 = DVar3;
      }
      uVar12 = (x >> 3) + (long)ybase;
      puVar15 = (uint *)(uVar12 & 0xfffffffffffffffc);
      uVar19 = (uVar10 & 7) + ((uint)uVar12 & 3) * 8;
      local_90 = (iVar13 + uVar19) - 1 & 0x1f;
      local_7c = -(uint)(uVar19 == 0) | ~(-1 << (-(char)uVar19 & 0x1fU));
      local_80 = -1 << (~(byte)local_90 & 0x1f);
      uVar27 = (uVar10 - uVar27) +
               (uint)*(ushort *)
                      ((ulong)(Lisp_world + ((uint)(byte)*args + *(int *)(pDVar5 + uVar6 + 0x12))) ^
                      2);
      ScreenLocked = 1;
      if ((int)uVar27 < 0) {
        uVar6 = -(ulong)(7 - uVar27 >> 3);
      }
      else {
        uVar6 = (ulong)(uVar27 >> 3);
      }
      uVar6 = (long)Lisp_world +
              uVar6 + ((ulong)Lisp_world[uVar26 + 5] |
                      (ulong)(uint)(*(int *)(Lisp_world + uVar26 + 4) << 0x10)) * 2;
      local_58 = local_80 & local_7c;
      iVar11 = (uVar19 + iVar13 >> 5) - 1;
      puVar20 = (uint *)(uVar6 & 0xfffffffffffffffc);
      uVar27 = (uVar27 & 7) + ((uint)uVar6 & 3) * 8;
      local_64 = iVar13 + uVar27 + 0x1f & 0x1f;
      uVar22 = uVar27 - uVar19 & 0x1f;
      uVar28 = uVar19 - uVar27 & 0x1f;
      uVar16 = 0;
      local_8c = -(uint)(uVar22 == 0) | ~(-1 << (sbyte)uVar22);
      uVar14 = -(uVar2 >> 0xb & 1);
      uVar10 = (uint)uVar1;
      do {
        uVar23 = *puVar20;
        sVar8 = (sbyte)uVar28;
        sVar9 = (sbyte)uVar22;
        if ((uVar19 < uVar27) && (0x20 < (int)(uVar27 + iVar13))) {
          puVar24 = puVar20 + 2;
          uVar29 = puVar20[1] >> sVar8 & local_8c | uVar23 << sVar9;
          uVar16 = ~local_8c & puVar20[1] << sVar9;
        }
        else {
          puVar24 = puVar20 + 1;
          if (uVar19 < uVar27) {
            uVar29 = uVar23 << sVar9;
          }
          else {
            uVar29 = uVar23 >> sVar8 & local_8c;
            uVar16 = ~local_8c & uVar23 << sVar9;
          }
        }
        uVar29 = uVar29 ^ uVar14;
        puVar7 = puVar15;
        uVar23 = local_58;
        if ((int)(uVar19 + iVar13) < 0x21) {
LAB_00110a67:
          uVar25 = *puVar7;
          switch(uVar17) {
          case 1:
            uVar29 = uVar29 & uVar25;
            break;
          case 2:
            uVar29 = uVar29 | uVar25;
            break;
          case 3:
            uVar29 = uVar29 ^ uVar25;
          }
          *puVar7 = uVar25 & ~uVar23 | uVar29 & uVar23;
        }
        else {
          uVar23 = *puVar15;
          switch(uVar17) {
          case 1:
            uVar29 = uVar29 & uVar23;
            break;
          case 2:
            uVar29 = uVar29 | uVar23;
            break;
          case 3:
            uVar29 = uVar29 ^ uVar23;
          }
          *puVar15 = uVar29 & local_7c | uVar23 & ~local_7c;
          puVar7 = puVar15 + 1;
          if (uVar27 == uVar19) {
            if ((uVar2 >> 0xb & 1) == 0) {
              switch(uVar17) {
              case 0:
                if (0 < iVar11) {
                  uVar23 = iVar11 + 1;
                  do {
                    uVar29 = *puVar24;
                    puVar24 = puVar24 + 1;
                    *puVar7 = uVar29;
                    puVar7 = puVar7 + 1;
                    uVar23 = uVar23 - 1;
                  } while (1 < uVar23);
                }
                break;
              case 1:
                if (0 < iVar11) {
                  uVar23 = iVar11 + 1;
                  do {
                    *puVar7 = *puVar7 & *puVar24;
                    puVar24 = puVar24 + 1;
                    puVar7 = puVar7 + 1;
                    uVar23 = uVar23 - 1;
                  } while (1 < uVar23);
                }
                break;
              case 2:
                if (0 < iVar11) {
                  uVar23 = iVar11 + 1;
                  do {
                    *puVar7 = *puVar7 | *puVar24;
                    puVar24 = puVar24 + 1;
                    puVar7 = puVar7 + 1;
                    uVar23 = uVar23 - 1;
                  } while (1 < uVar23);
                }
                break;
              case 3:
                if (0 < iVar11) {
                  uVar23 = iVar11 + 1;
                  do {
                    *puVar7 = *puVar7 ^ *puVar24;
                    puVar24 = puVar24 + 1;
                    puVar7 = puVar7 + 1;
                    uVar23 = uVar23 - 1;
                  } while (1 < uVar23);
                }
              }
            }
            else {
              switch(uVar17) {
              case 0:
                if (0 < iVar11) {
                  uVar23 = iVar11 + 1;
                  do {
                    uVar29 = *puVar24;
                    puVar24 = puVar24 + 1;
                    *puVar7 = ~uVar29;
                    puVar7 = puVar7 + 1;
                    uVar23 = uVar23 - 1;
                  } while (1 < uVar23);
                }
                break;
              case 1:
                if (0 < iVar11) {
                  uVar23 = iVar11 + 1;
                  do {
                    *puVar7 = *puVar7 & ~*puVar24;
                    puVar24 = puVar24 + 1;
                    puVar7 = puVar7 + 1;
                    uVar23 = uVar23 - 1;
                  } while (1 < uVar23);
                }
                break;
              case 2:
                if (0 < iVar11) {
                  uVar23 = iVar11 + 1;
                  do {
                    *puVar7 = *puVar7 | ~*puVar24;
                    puVar24 = puVar24 + 1;
                    puVar7 = puVar7 + 1;
                    uVar23 = uVar23 - 1;
                  } while (1 < uVar23);
                }
                break;
              case 3:
                if (0 < iVar11) {
                  uVar23 = iVar11 + 1;
                  do {
                    uVar29 = *puVar24;
                    puVar24 = puVar24 + 1;
                    *puVar7 = ~(uVar29 ^ *puVar7);
                    puVar7 = puVar7 + 1;
                    uVar23 = uVar23 - 1;
                  } while (1 < uVar23);
                }
              }
            }
          }
          else if ((uVar2 >> 0xb & 1) == 0) {
            switch(uVar17) {
            case 0:
              if (0 < iVar11) {
                uVar23 = iVar11 + 1;
                do {
                  uVar29 = *puVar24;
                  puVar24 = puVar24 + 1;
                  uVar25 = uVar29 >> sVar8 | uVar16;
                  uVar16 = uVar29 << sVar9;
                  *puVar7 = uVar25;
                  puVar7 = puVar7 + 1;
                  uVar23 = uVar23 - 1;
                } while (1 < uVar23);
              }
              break;
            case 1:
              if (0 < iVar11) {
                uVar29 = iVar11 + 1;
                uVar23 = uVar16;
                do {
                  uVar25 = *puVar24;
                  puVar24 = puVar24 + 1;
                  uVar16 = uVar25 << sVar9;
                  *puVar7 = *puVar7 & (uVar25 >> sVar8 | uVar23);
                  puVar7 = puVar7 + 1;
                  uVar29 = uVar29 - 1;
                  uVar23 = uVar16;
                } while (1 < uVar29);
              }
              break;
            case 2:
              if (0 < iVar11) {
                uVar29 = iVar11 + 1;
                puVar30 = puVar7;
                uVar23 = uVar16;
                do {
                  uVar25 = *puVar24;
                  puVar24 = puVar24 + 1;
                  uVar16 = uVar25 << sVar9;
                  puVar7 = puVar30 + 1;
                  *puVar30 = uVar23 | *puVar30 | uVar25 >> sVar8;
                  uVar29 = uVar29 - 1;
                  puVar30 = puVar7;
                  uVar23 = uVar16;
                } while (1 < uVar29);
              }
              break;
            case 3:
              if (0 < iVar11) {
                uVar29 = iVar11 + 1;
                uVar23 = uVar16;
                do {
                  uVar25 = *puVar24;
                  puVar24 = puVar24 + 1;
                  uVar16 = uVar25 << sVar9;
                  *puVar7 = *puVar7 ^ (uVar25 >> sVar8 | uVar23);
                  puVar7 = puVar7 + 1;
                  uVar29 = uVar29 - 1;
                  uVar23 = uVar16;
                } while (1 < uVar29);
              }
            }
          }
          else {
            switch(uVar17) {
            case 0:
              if (0 < iVar11) {
                uVar23 = iVar11 + 1;
                do {
                  uVar29 = *puVar24;
                  puVar24 = puVar24 + 1;
                  uVar25 = uVar29 >> sVar8 | uVar16;
                  uVar16 = uVar29 << sVar9;
                  *puVar7 = ~uVar25;
                  puVar7 = puVar7 + 1;
                  uVar23 = uVar23 - 1;
                } while (1 < uVar23);
              }
              break;
            case 1:
              if (0 < iVar11) {
                uVar23 = iVar11 + 1;
                do {
                  uVar29 = *puVar24;
                  puVar24 = puVar24 + 1;
                  uVar25 = uVar29 >> sVar8 | uVar16;
                  uVar16 = uVar29 << sVar9;
                  *puVar7 = *puVar7 & ~uVar25;
                  puVar7 = puVar7 + 1;
                  uVar23 = uVar23 - 1;
                } while (1 < uVar23);
              }
              break;
            case 2:
              if (0 < iVar11) {
                uVar23 = iVar11 + 1;
                do {
                  uVar29 = *puVar24;
                  puVar24 = puVar24 + 1;
                  uVar25 = uVar29 >> sVar8 | uVar16;
                  uVar16 = uVar29 << sVar9;
                  *puVar7 = *puVar7 | ~uVar25;
                  puVar7 = puVar7 + 1;
                  uVar23 = uVar23 - 1;
                } while (1 < uVar23);
              }
              break;
            case 3:
              if (0 < iVar11) {
                uVar23 = iVar11 + 1;
                puVar30 = puVar7;
                do {
                  uVar29 = *puVar24;
                  puVar24 = puVar24 + 1;
                  uVar25 = uVar29 >> sVar8 | uVar16;
                  uVar16 = uVar29 << sVar9;
                  puVar7 = puVar30 + 1;
                  *puVar30 = ~(uVar25 ^ *puVar30);
                  uVar23 = uVar23 - 1;
                  puVar30 = puVar7;
                } while (1 < uVar23);
              }
            }
          }
          if (local_90 != 0x1f) {
            uVar29 = uVar16;
            if (local_64 <= local_90) {
              uVar29 = *puVar24 >> sVar8 & local_8c | uVar16;
            }
            uVar29 = uVar29 ^ uVar14;
            uVar23 = local_80;
            goto LAB_00110a67;
          }
        }
        uVar23 = (uint)uVar18;
        uVar29 = (uint)uVar21;
        if (((uVar21 | uVar18) & 0x1f) != 0) {
          uVar29 = uVar19 + uVar21;
          uVar19 = uVar29 & 0x1f;
          local_90 = (uVar19 + iVar13) - 1 & 0x1f;
          local_7c = -(uint)(uVar19 == 0) | ~(-1 << (-(char)uVar19 & 0x1fU));
          local_80 = -1 << (~(byte)local_90 & 0x1f);
          local_58 = local_80 & local_7c;
          iVar11 = (uVar19 + iVar13 >> 5) - 1;
          uVar23 = uVar27 + uVar18;
          uVar27 = uVar23 & 0x1f;
          local_64 = iVar13 + 0x1f + uVar23 & 0x1f;
          uVar28 = uVar29 - uVar23 & 0x1f;
          uVar22 = uVar23 - uVar29 & 0x1f;
          local_8c = -(uint)(uVar22 == 0) | ~(-1 << (sbyte)uVar22);
        }
        puVar15 = puVar15 + (uVar29 >> 5);
        puVar20 = puVar20 + (uVar23 >> 5);
        bVar4 = (int)uVar10 < 2;
        uVar10 = uVar10 - 1;
        if (bVar4) {
          if ((DisplayRegion68k <= ybase) && (ybase <= DISP_MAX_Address)) {
            flush_display_lineregion(x,ybase,iVar13,(uint)uVar1);
          }
          ScreenLocked = 0;
          return;
        }
      } while( true );
    }
  }
LAB_001101e2:
  if ((BLTCHAR_index == 0) &&
     (BLTCHAR_index = get_package_atom("\\MAIKO.PUNTBLTCHAR",0x12,"INTERLISP",9,0),
     BLTCHAR_index == 0xffffffff)) {
    return;
  }
  MachineState.csp = MachineState.csp + 4;
  ccfuncall(BLTCHAR_index,3,3);
  return;
}

Assistant:

void newbltchar(LispPTR *args) {
  DISPLAYDATA *displaydata68k;
  int right, left, curx;
  PILOTBBT *pbt;
  int lmargin, rmargin, xoff;
  int base;
  int h, w;
#ifdef REALCURSOR
  int displayflg;
#endif
  int backwardflg = 0, sx, dx, srcbpl, dstbpl, src_comp, op;
  DLword *srcbase, *dstbase;
  int gray = 0;
#ifdef NEWBITBLT
  int num_gray = 0, curr_gray_line = 0;
#endif

  displaydata68k = (DISPLAYDATA *)NativeAligned4FromLAddr(((BLTARG *)args)->displaydata);

  if ((displaydata68k->ddcharset & 0xFFFF) != ((BLTARG *)args)->charset) {
    /*if(changecharset_display(displaydata68k, ((BLTARG *)args)->charset) ==-1)*/
    PUNT_TO_BLTCHAR;
  }

  if (displaydata68k->ddslowprintingcase) { PUNT_TO_BLTCHAR; /** \SLOWBLTCHAR--return;**/ }

  FGetNum(displaydata68k->ddxposition, curx);
  FGetNum(displaydata68k->ddrightmargin, rmargin);
  FGetNum(displaydata68k->ddleftmargin, lmargin);
  FGetNum(displaydata68k->ddxoffset, xoff);

  right =
      curx +
      GETWORD((DLword *)NativeAligned2FromLAddr(displaydata68k->ddcharimagewidths + ((BLTARG *)args)->char8code));

  if ((right > rmargin) && (curx > lmargin)) PUNT_TO_BLTCHAR;
  if (((BLTARG *)args)->displaystream != *TOPWDS68k) PUNT_TO_BLTCHAR;

  {
    int newpos;
    newpos = curx +
             GETWORD((DLword *)NativeAligned2FromLAddr(displaydata68k->ddwidthscache + ((BLTARG *)args)->char8code));

    if ((0 <= newpos) && (newpos < 65536))
      (displaydata68k->ddxposition) = (LispPTR)(S_POSITIVE | newpos);
    else if (-65537 < newpos)
      (displaydata68k->ddxposition) = (LispPTR)(S_NEGATIVE | (0xffff & newpos));
    else {
      PUNT_TO_BLTCHAR;
    }
  }

  curx += xoff;
  right += xoff;
  if (right > (int)(displaydata68k->ddclippingright)) right = displaydata68k->ddclippingright;

  if (curx > (int)(displaydata68k->ddclippingleft))
    left = curx;
  else
    left = displaydata68k->ddclippingleft;

  pbt = (PILOTBBT *)NativeAligned4FromLAddr(displaydata68k->ddpilotbbt);
  h = pbt->pbtheight;
  w = right - left;
  if ((h <= 0) || (w <= 0)) return;

  srcbase = (DLword *)NativeAligned2FromLAddr(VAG2(pbt->pbtsourcehi, pbt->pbtsourcelo));

  dstbase = (DLword *)NativeAligned2FromLAddr(VAG2(pbt->pbtdesthi, pbt->pbtdestlo));

  op = pbt->pbtoperation;
  src_comp = pbt->pbtsourcetype;

  srcbpl = abs(pbt->pbtsourcebpl);
  dstbpl = abs(pbt->pbtdestbpl);
  base = GETWORD(NativeAligned2FromLAddr(displaydata68k->ddoffsetscache + ((BLTARG *)args)->char8code));
  sx = base + left - curx;
  dx = left;

  LOCKSCREEN;

#ifdef REALCURSOR
  displayflg = (cursorin(pbt->pbtdesthi, (pbt->pbtdestlo + (left >> 4)), (right - left),
                         pbt->pbtheight, pbt->pbtbackward));
  if (displayflg) HideCursor;
#endif /* REALCURSOR */

#ifdef NEWBITBLT
  bitblt(srcbase, dstbase, sx, dx, w, h, srcbpl, dstbpl, backwardflg, src_comp, op, gray, num_gray,
         curr_gray_line);
#else
  new_char_bitblt_code;
#endif

#ifdef DISPLAYBUFFER
#ifdef COLOR
  if (MonoOrColor == MONO_SCREEN)
#endif /* COLOR */

    if (in_display_segment(dstbase)) {
      /*      DBPRINT(("newbltchar:  x %d, y 0x%x, w %d, h %d.\n", dx, dstbase, w, h));*/
      flush_display_lineregion(dx, dstbase, w, h);
    }
#endif

#ifdef XWINDOW
  if (in_display_segment(dstbase)) flush_display_lineregion(dx, dstbase, w, h);
#endif /* XWINDOW */
#ifdef SDL
  if (in_display_segment(dstbase)) flush_display_lineregion(dx, dstbase, w, h);
#endif /* SDL */
#ifdef DOS
  if (in_display_segment(dstbase)) flush_display_lineregion(dx, dstbase, w, h);
#endif /* DOS */

#ifdef REALCURSOR
  if (displayflg) ShowCursor;
#endif /* REALCURSOR */

  UNLOCKSCREEN;

}